

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

bool __thiscall CaDiCaL::Solver::disconnect_proof_tracer(Solver *this,Tracer *tracer)

{
  bool bVar1;
  State *pSVar2;
  long in_RSI;
  Solver *in_RDI;
  Tracer *in_stack_00000010;
  bool res;
  char *in_stack_ffffffffffffffd8;
  
  require_solver_pointer_to_be_non_zero(in_RDI,in_stack_ffffffffffffffd8,(char *)0xe29448);
  if (in_RDI->external == (External *)0x0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "bool CaDiCaL::Solver::disconnect_proof_tracer(Tracer *)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    fprintf(_stderr,"external solver not initialized");
    fputc(10,_stderr);
    fflush(_stderr);
    abort();
  }
  if (in_RDI->internal == (Internal *)0x0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "bool CaDiCaL::Solver::disconnect_proof_tracer(Tracer *)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    fprintf(_stderr,"internal solver not initialized");
    fputc(10,_stderr);
    fflush(_stderr);
    abort();
  }
  pSVar2 = state(in_RDI);
  if ((*pSVar2 & VALID) == 0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "bool CaDiCaL::Solver::disconnect_proof_tracer(Tracer *)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    fprintf(_stderr,"solver in invalid state");
    fputc(10,_stderr);
    fflush(_stderr);
    abort();
  }
  if (in_RSI != 0) {
    bVar1 = Internal::disconnect_proof_tracer((Internal *)tracer,in_stack_00000010);
    return bVar1;
  }
  fatal_message_start();
  fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
          "bool CaDiCaL::Solver::disconnect_proof_tracer(Tracer *)",
          "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
         );
  fprintf(_stderr,"can not disconnect zero tracer");
  fputc(10,_stderr);
  fflush(_stderr);
  abort();
}

Assistant:

bool Solver::disconnect_proof_tracer (Tracer *tracer) {
  LOG_API_CALL_BEGIN ("disconnect proof tracer");
  REQUIRE_VALID_STATE ();
  REQUIRE (tracer, "can not disconnect zero tracer");
  bool res = internal->disconnect_proof_tracer (tracer);
  LOG_API_CALL_RETURNS ("connect proof tracer", res);
  return res;
}